

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_namelist.cc
# Opt level: O3

time_t ctemplate::TemplateNamelist::GetLastmodTime(void)

{
  int iVar1;
  NameListType *pNVar2;
  TemplateCache *this;
  long lVar3;
  _Hash_node_base *p_Var4;
  string path;
  stat statbuf;
  string local_e0;
  stat local_c0;
  
  pNVar2 = GetList_abi_cxx11_();
  p_Var4 = (pNVar2->_M_h)._M_before_begin._M_nxt;
  lVar3 = -1;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      this = default_template_cache();
      TemplateCache::FindTemplateFilename(&local_e0,this,(string *)(p_Var4 + 1));
      if (local_e0._M_string_length != 0) {
        iVar1 = stat(local_e0._M_dataplus._M_p,&local_c0);
        if ((iVar1 == 0) && (lVar3 <= local_c0.st_mtim.tv_sec)) {
          lVar3 = local_c0.st_mtim.tv_sec;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return lVar3;
}

Assistant:

time_t TemplateNamelist::GetLastmodTime() {
  time_t retval = -1;

  const NameListType& the_list = TemplateNamelist::GetList();
  for (NameListType::const_iterator iter = the_list.begin();
       iter != the_list.end();
       ++iter) {
    // Only prepend root_dir if *iter isn't an absolute path:
    const string path = Template::FindTemplateFilename(*iter);
    struct stat statbuf;
    if (path.empty() || stat(path.c_str(), &statbuf) != 0)
      continue;  // ignore files we can't find
    retval = max(retval, statbuf.st_mtime);
  }
  return retval;
}